

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateImportConfig(cmExportFileGenerator *this,ostream *os,string *config)

{
  string suffix;
  string asStack_58 [32];
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>(asStack_58,"_",(allocator<char> *)&local_38);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)asStack_58);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_38,config);
    std::__cxx11::string::append(asStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  (*this->_vptr_cmExportFileGenerator[0xe])(this,os,config,asStack_58);
  std::__cxx11::string::~string(asStack_58);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportConfig(std::ostream& os,
                                                 const std::string& config)
{
  // Construct the property configuration suffix.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // Generate the per-config target information.
  this->GenerateImportTargetsConfig(os, config, suffix);
}